

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O1

int od_ec_decode_cdf_q15(od_ec_dec *dec,uint16_t *icdf,int nsyms)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = -1;
  uVar6 = (uint)dec->rng;
  iVar1 = nsyms << 2;
  do {
    uVar5 = uVar6;
    uVar4 = (uint)(*icdf >> 6) * (uint)(dec->rng >> 8) >> 1;
    iVar2 = iVar1 + -4;
    uVar6 = (iVar1 + uVar4) - 4;
    iVar3 = iVar3 + 1;
    icdf = icdf + 1;
    iVar1 = iVar2;
  } while (dec->dif >> 0x10 < uVar6);
  uVar6 = (uVar5 - uVar4) - iVar2;
  od_ec_dec_normalize(dec,dec->dif + (uVar4 + iVar2) * -0x10000,uVar6,uVar6);
  return iVar3;
}

Assistant:

int od_ec_decode_cdf_q15(od_ec_dec *dec, const uint16_t *icdf, int nsyms) {
  od_ec_window dif;
  unsigned r;
  unsigned c;
  unsigned u;
  unsigned v;
  int ret;
  (void)nsyms;
  dif = dec->dif;
  r = dec->rng;
  const int N = nsyms - 1;

  assert(dif >> (OD_EC_WINDOW_SIZE - 16) < r);
  assert(icdf[nsyms - 1] == OD_ICDF(CDF_PROB_TOP));
  assert(32768U <= r);
  assert(7 - EC_PROB_SHIFT >= 0);
  c = (unsigned)(dif >> (OD_EC_WINDOW_SIZE - 16));
  v = r;
  ret = -1;
  do {
    u = v;
    v = ((r >> 8) * (uint32_t)(icdf[++ret] >> EC_PROB_SHIFT) >>
         (7 - EC_PROB_SHIFT));
    v += EC_MIN_PROB * (N - ret);
  } while (c < v);
  assert(v < u);
  assert(u <= r);
  r = u - v;
  dif -= (od_ec_window)v << (OD_EC_WINDOW_SIZE - 16);
  return od_ec_dec_normalize(dec, dif, r, ret);
}